

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonParse * jsonParseCached(sqlite3_context *pCtx,sqlite3_value **argv,sqlite3_context *pErrCtx)

{
  int iVar1;
  int iVar2;
  void *__s2;
  AuxData *pAVar3;
  JsonParse *pJVar4;
  AuxData *pAVar5;
  uint uVar6;
  int iVar7;
  JsonParse *pJVar8;
  int iVar9;
  uint uVar10;
  
  __s2 = sqlite3ValueText(*argv,'\x01');
  iVar1 = sqlite3ValueBytes(*argv,'\x01');
  uVar6 = 0;
  if (__s2 != (void *)0x0) {
    pAVar5 = pCtx->pVdbe->pAuxData;
    uVar10 = 0xffffffff;
    iVar9 = 0;
    pJVar4 = (JsonParse *)0x0;
    iVar2 = 0;
    do {
      if (pAVar5 != (AuxData *)0x0) {
        pAVar3 = pAVar5;
        do {
          if (pAVar3->iAuxArg == iVar9 + -0x68f72) {
            pJVar8 = (JsonParse *)pAVar3->pAux;
            goto LAB_001bf73e;
          }
          pAVar3 = pAVar3->pNextAux;
        } while (pAVar3 != (AuxData *)0x0);
      }
      pJVar8 = (JsonParse *)0x0;
LAB_001bf73e:
      iVar7 = iVar9;
      if (pJVar8 == (JsonParse *)0x0) break;
      iVar7 = iVar2;
      if (((pJVar4 == (JsonParse *)0x0) && (pJVar8->nJson == iVar1)) &&
         (iVar2 = bcmp(pJVar8->zJson,__s2,(long)iVar1), iVar2 == 0)) {
        pJVar8->nErr = '\0';
        pJVar4 = pJVar8;
      }
      else if (pJVar8->iHold < uVar10) {
        uVar10 = pJVar8->iHold;
        iVar7 = iVar9;
      }
      if (uVar6 < pJVar8->iHold) {
        uVar6 = pJVar8->iHold;
      }
      iVar9 = iVar9 + 1;
      iVar2 = iVar7;
    } while (iVar9 != 4);
    if (pJVar4 != (JsonParse *)0x0) {
      pJVar4->nErr = '\0';
      pJVar4->iHold = uVar6 + 1;
      return pJVar4;
    }
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pJVar4 = (JsonParse *)sqlite3Malloc((long)iVar1 + 0x31);
    }
    else {
      pJVar4 = (JsonParse *)0x0;
    }
    if (pJVar4 == (JsonParse *)0x0) {
      sqlite3_result_error_nomem(pCtx);
    }
    else {
      pJVar4->zJson = (char *)0x0;
      pJVar4->aUp = (u32 *)0x0;
      pJVar4->oom = '\0';
      pJVar4->nErr = '\0';
      pJVar4->iDepth = 0;
      pJVar4->nJson = 0;
      *(undefined8 *)&pJVar4->iHold = 0;
      pJVar4->nNode = 0;
      pJVar4->nAlloc = 0;
      pJVar4->aNode = (JsonNode *)0x0;
      pJVar8 = pJVar4 + 1;
      pJVar4->zJson = (char *)pJVar8;
      memcpy(pJVar8,__s2,(long)(iVar1 + 1));
      iVar2 = jsonParse(pJVar4,pErrCtx,(char *)pJVar8);
      if (iVar2 == 0) {
        pJVar4->nJson = iVar1;
        pJVar4->iHold = uVar6 + 1;
        sqlite3_set_auxdata(pCtx,iVar7 + -0x68f72,pJVar4,jsonParseFree);
        pAVar5 = pCtx->pVdbe->pAuxData;
        if (pAVar5 != (AuxData *)0x0) {
          while ((pAVar5->iAuxArg != iVar7 + -0x68f72 ||
                 ((0x68f71 < iVar7 && (pAVar5->iAuxOp != pCtx->iOp))))) {
            pAVar5 = pAVar5->pNextAux;
            if (pAVar5 == (AuxData *)0x0) {
              return (JsonParse *)0x0;
            }
          }
          return (JsonParse *)pAVar5->pAux;
        }
      }
      else {
        sqlite3_free(pJVar4);
      }
    }
  }
  return (JsonParse *)0x0;
}

Assistant:

static JsonParse *jsonParseCached(
  sqlite3_context *pCtx,
  sqlite3_value **argv,
  sqlite3_context *pErrCtx
){
  const char *zJson = (const char*)sqlite3_value_text(argv[0]);
  int nJson = sqlite3_value_bytes(argv[0]);
  JsonParse *p;
  JsonParse *pMatch = 0;
  int iKey;
  int iMinKey = 0;
  u32 iMinHold = 0xffffffff;
  u32 iMaxHold = 0;
  if( zJson==0 ) return 0;
  for(iKey=0; iKey<JSON_CACHE_SZ; iKey++){
    p = (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iKey);
    if( p==0 ){
      iMinKey = iKey;
      break;
    }
    if( pMatch==0
     && p->nJson==nJson
     && memcmp(p->zJson,zJson,nJson)==0
    ){
      p->nErr = 0;
      pMatch = p;
    }else if( p->iHold<iMinHold ){
      iMinHold = p->iHold;
      iMinKey = iKey;
    }
    if( p->iHold>iMaxHold ){
      iMaxHold = p->iHold;
    }
  }
  if( pMatch ){
    pMatch->nErr = 0;
    pMatch->iHold = iMaxHold+1;
    return pMatch;
  }
  p = sqlite3_malloc64( sizeof(*p) + nJson + 1 );
  if( p==0 ){
    sqlite3_result_error_nomem(pCtx);
    return 0;
  }
  memset(p, 0, sizeof(*p));
  p->zJson = (char*)&p[1];
  memcpy((char*)p->zJson, zJson, nJson+1);
  if( jsonParse(p, pErrCtx, p->zJson) ){
    sqlite3_free(p);
    return 0;
  }
  p->nJson = nJson;
  p->iHold = iMaxHold+1;
  sqlite3_set_auxdata(pCtx, JSON_CACHE_ID+iMinKey, p,
                      (void(*)(void*))jsonParseFree);
  return (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iMinKey);
}